

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtUnionFind.cpp
# Opt level: O2

void __thiscall cbtUnionFind::sortIslands(cbtUnionFind *this)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  cbtUnionFindElementSortPredicate local_19;
  
  uVar1 = (this->m_elements).m_size;
  for (uVar3 = 0; (~((int)uVar1 >> 0x1f) & uVar1) != uVar3; uVar3 = uVar3 + 1) {
    iVar2 = find(this,(int)uVar3);
    (this->m_elements).m_data[uVar3].m_id = iVar2;
  }
  cbtAlignedObjectArray<cbtElement>::quickSort<cbtUnionFindElementSortPredicate>
            (&this->m_elements,&local_19);
  return;
}

Assistant:

void cbtUnionFind::sortIslands()
{
	//first store the original body index, and islandId
	int numElements = m_elements.size();

	for (int i = 0; i < numElements; i++)
	{
		m_elements[i].m_id = find(i);
#ifndef STATIC_SIMULATION_ISLAND_OPTIMIZATION
		m_elements[i].m_sz = i;
#endif  //STATIC_SIMULATION_ISLAND_OPTIMIZATION
	}

	// Sort the vector using predicate and std::sort
	//std::sort(m_elements.begin(), m_elements.end(), cbtUnionFindElementSortPredicate);
	m_elements.quickSort(cbtUnionFindElementSortPredicate());
}